

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::DropIndex(SM_Manager *this,char *relName,char *attrName)

{
  uint uVar1;
  uint extraout_EAX;
  RC RVar2;
  ostream *poVar3;
  AttrCatEntry *aEntry;
  RelCatEntry *rEntry;
  RM_Record attrRec;
  RM_Record relRec;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"DropIndex\n");
  poVar3 = std::operator<<(poVar3,"   relName =");
  poVar3 = std::operator<<(poVar3,relName);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"   attrName=");
  poVar3 = std::operator<<(poVar3,attrName);
  std::operator<<(poVar3,"\n");
  RM_Record::RM_Record(&relRec);
  uVar1 = GetRelEntry(this,relName,&relRec,&rEntry);
  if (uVar1 == 0) {
    RM_Record::RM_Record(&attrRec);
    uVar1 = FindAttr(this,relName,attrName,&attrRec,&aEntry);
    if (uVar1 == 0) {
      if (aEntry->indexNo == -1) {
        uVar1 = 0x133;
      }
      else {
        IX_Manager::DestroyIndex(this->ixm);
        uVar1 = extraout_EAX;
        if (extraout_EAX == 0) {
          aEntry->indexNo = -1;
          rEntry->indexCount = rEntry->indexCount + -1;
          uVar1 = RM_FileHandle::UpdateRec(&this->relcatFH,&relRec);
          if (uVar1 == 0) {
            uVar1 = RM_FileHandle::UpdateRec(&this->attrcatFH,&attrRec);
            if (uVar1 == 0) {
              RVar2 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
              if (RVar2 == 0) {
                RVar2 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
                uVar1 = (uint)(RVar2 != 0);
              }
              else {
                uVar1 = 1;
              }
            }
          }
        }
      }
    }
    RM_Record::~RM_Record(&attrRec);
  }
  RM_Record::~RM_Record(&relRec);
  return uVar1;
}

Assistant:

RC SM_Manager::DropIndex(const char *relName,
                         const char *attrName)
{
  cout << "DropIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // retrieve relation
    return (rc);

  RM_Record attrRec; // Finds the appropriate attribute
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  if((aEntry->indexNo == NO_INDEXES)) // Check that there is actually an index
    return (SM_NOINDEX);
  
  // Destroys the index
  if((rc = ixm.DestroyIndex(relName, aEntry->indexNo)))
    return (rc);

  // Update entries in the relation and attribute records
  aEntry->indexNo = NO_INDEXES;
  rEntry->indexCount--;

  // write both catalog pages back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}